

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

void chaiscript::Boxed_Number::check_divide_by_zero<unsigned_long>(unsigned_long t)

{
  arithmetic_error *this;
  allocator<char> local_39;
  string local_38;
  
  if (t != 0) {
    return;
  }
  this = (arithmetic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"divide by zero",&local_39)
  ;
  exception::arithmetic_error::arithmetic_error(this,&local_38);
  __cxa_throw(this,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr static inline void check_divide_by_zero([[maybe_unused]] T t) {
#ifndef CHAISCRIPT_NO_PROTECT_DIVIDEBYZERO
      if constexpr (!std::is_floating_point<T>::value) {
        if (t == 0) {
          throw chaiscript::exception::arithmetic_error("divide by zero");
        }
      }
#endif
    }